

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash-sha1.c
# Opt level: O0

void p_crypto_hash_sha1_finish(PHashSHA1 *ctx)

{
  puint32 pVar1;
  puint32 pVar2;
  uint uVar3;
  int local_24;
  pint last;
  pint left;
  puint32 low;
  puint32 high;
  PHashSHA1 *ctx_local;
  
  uVar3 = ctx->len_low & 0x3f;
  if (uVar3 < 0x38) {
    local_24 = 0x38 - uVar3;
  }
  else {
    local_24 = 0x78 - uVar3;
  }
  pVar1 = ctx->len_low;
  pVar2 = ctx->len_high;
  uVar3 = ctx->len_low;
  if (0 < local_24) {
    p_crypto_hash_sha1_update(ctx,pp_crypto_hash_sha1_pad,(long)local_24);
  }
  (ctx->buf).buf_w[0xe] = pVar2 << 3 | uVar3 >> 0x1d;
  (ctx->buf).buf_w[0xf] = pVar1 << 3;
  pp_crypto_hash_sha1_swap_bytes((puint32 *)ctx,0xe);
  pp_crypto_hash_sha1_process(ctx,(puint32 *)ctx);
  pp_crypto_hash_sha1_swap_bytes(ctx->hash,5);
  return;
}

Assistant:

void
p_crypto_hash_sha1_finish (PHashSHA1 *ctx)
{
	puint32	high;
	puint32	low;
	pint	left;
	pint	last;

	left = ctx->len_low & 0x3F;
	last = (left < 56) ? (56 - left) : (120 - left);

	low = ctx->len_low << 3;
	high = ctx->len_high << 3
	     | ctx->len_low >> 29;

	if (last > 0)
		p_crypto_hash_sha1_update (ctx, pp_crypto_hash_sha1_pad, (psize) last);

	ctx->buf.buf_w[14] = high;
	ctx->buf.buf_w[15] = low;

	pp_crypto_hash_sha1_swap_bytes (ctx->buf.buf_w, 14);
	pp_crypto_hash_sha1_process (ctx, ctx->buf.buf_w);

	pp_crypto_hash_sha1_swap_bytes (ctx->hash, 5);
}